

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::SListLeaf::insert
          (SListLeaf *this,LeafData *ld)

{
  MaybeUninit<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  *pMVar1;
  bool bVar2;
  uint uVar3;
  Clause *pCVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined4 unaff_R12D;
  undefined4 unaff_R14D;
  undefined8 unaff_R15;
  uint64_t local_98;
  uint64_t uStack_90;
  undefined1 local_88;
  Rhs local_70;
  
  uVar3 = (ld->super_SelectedLiteral).litIdx;
  pCVar4 = (ld->super_SelectedLiteral).cl;
  bVar2 = (ld->super_SelectedLiteral).interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._isSome;
  if (bVar2 == false) {
    local_88 = ld->_inLitPlus;
    local_98 = (ld->_toRewrite).super_TermList._content;
    uStack_90 = (ld->_toRewrite)._sort._content;
    local_70.super_SelectedLiteral.litIdx = (ld->super_SelectedLiteral).litIdx;
    local_70.super_SelectedLiteral.cl = (ld->super_SelectedLiteral).cl;
    bVar6 = 0;
  }
  else {
    pMVar1 = &(ld->super_SelectedLiteral).interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem;
    bVar6 = *(byte *)&pMVar1->_elem & 3;
    unaff_R14D = *(undefined4 *)
                  ((long)&(ld->super_SelectedLiteral).interpreted.
                          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                          ._elem._elem + 0x11);
    unaff_R15 = *(undefined8 *)
                 ((long)&(ld->super_SelectedLiteral).interpreted.
                         super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                         ._elem._elem + 9);
    unaff_R12D = *(undefined4 *)
                  ((long)&(ld->super_SelectedLiteral).interpreted.
                          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                          ._elem._elem + 1);
    local_88 = ld->_inLitPlus;
    local_98 = (ld->_toRewrite).super_TermList._content;
    uStack_90 = (ld->_toRewrite)._sort._content;
    local_70.super_SelectedLiteral.litIdx = (ld->super_SelectedLiteral).litIdx;
    local_70.super_SelectedLiteral.cl = (ld->super_SelectedLiteral).cl;
    local_70.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._21_7_ = 0;
    local_70.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._0_5_ = *(uint5 *)&pMVar1->_elem & 0xffffffff03;
    local_70.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._5_3_ = 0;
    local_70.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._9_3_ = (undefined3)unaff_R15;
    local_70.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._8_4_ =
         (uint)(uint3)local_70.super_SelectedLiteral.interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem._9_3_ << 8;
    local_70.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._12_4_ = (undefined4)((ulong)unaff_R15 >> 0x18);
    local_70.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0xf] = (char)((ulong)unaff_R15 >> 0x38);
    local_70.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._17_3_ = (undefined3)unaff_R14D;
    local_70.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0x13] = (char)((uint)unaff_R14D >> 0x18);
  }
  local_70._toRewrite.super_TermList._content = local_98;
  local_70._toRewrite._sort._content = uStack_90;
  local_70._inLitPlus = (bool)local_88;
  local_70.super_SelectedLiteral.interpreted.
  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ._isSome = bVar2;
  puVar5 = (undefined8 *)
           Lib::
           SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
           ::insertPositionRaw<Inferences::ALASCA::SuperpositionConf::Rhs>
                     (&this->_children,&local_70);
  *puVar5 = pCVar4;
  *(uint *)(puVar5 + 1) = uVar3;
  *(bool *)((long)puVar5 + 0xc) = bVar2;
  if (bVar2 != false) {
    puVar5[2] = 0;
    puVar5[3] = 0;
    *(undefined8 *)((long)puVar5 + 0x1c) = 0;
    *(undefined8 *)((long)puVar5 + 0x24) = 0;
    *(byte *)(puVar5 + 2) = bVar6;
    *(undefined4 *)((long)puVar5 + 0x11) = unaff_R12D;
    *(undefined8 *)((long)puVar5 + 0x19) = unaff_R15;
    *(undefined4 *)((long)puVar5 + 0x21) = unaff_R14D;
  }
  *(undefined1 *)(puVar5 + 8) = local_88;
  puVar5[6] = local_98;
  puVar5[7] = uStack_90;
  return;
}

Assistant:

void insert(LeafData ld) override { _children.insert(ld); }